

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauEnum.c
# Opt level: O2

void Dau_EnumTestDump(Vec_Ptr_t *vSets,char *pFileName)

{
  FILE *__stream;
  Vec_Ptr_t *p;
  void *pvVar1;
  uint i;
  int i_00;
  
  __stream = fopen(pFileName,"wb");
  if (__stream != (FILE *)0x0) {
    for (i = 0; (int)i < vSets->nSize; i = i + 1) {
      p = (Vec_Ptr_t *)Vec_PtrEntry(vSets,i);
      fprintf(__stream,"VARIABLE NUMBER %d:\n",(ulong)i);
      for (i_00 = 0; i_00 < p->nSize; i_00 = i_00 + 1) {
        pvVar1 = Vec_PtrEntry(p,i_00);
        fprintf(__stream,"%s\n",pvVar1);
      }
    }
    fclose(__stream);
    return;
  }
  return;
}

Assistant:

void Dau_EnumTestDump( Vec_Ptr_t * vSets, char * pFileName )
{ 
    FILE * pFile;
    Vec_Ptr_t * vOne;
    char * pName;
    int v, k;
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
        return;
    Vec_PtrForEachEntry( Vec_Ptr_t *, vSets, vOne, v )
    {
        fprintf( pFile, "VARIABLE NUMBER %d:\n", v );
        Vec_PtrForEachEntry( char *, vOne, pName, k )
            fprintf( pFile, "%s\n", pName );
    }
    fclose( pFile );
}